

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-mmap.cpp
# Opt level: O2

void __thiscall llama_file::impl::seek(impl *this,size_t offset,int whence)

{
  int iVar1;
  runtime_error *this_00;
  int *piVar2;
  char *pcVar3;
  string sStack_38;
  
  iVar1 = fseek((FILE *)this->fp,offset,whence);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  format_abi_cxx11_(&sStack_38,"seek error: %s",pcVar3);
  std::runtime_error::runtime_error(this_00,(string *)&sStack_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void seek(size_t offset, int whence) const {
// TODO: this ifdef is never true?
#ifdef _WIN32
        int ret = _fseeki64(fp, (__int64) offset, whence);
#else
        int ret = std::fseek(fp, (long) offset, whence);
#endif
        if (ret != 0) {
            throw std::runtime_error(format("seek error: %s", strerror(errno)));
        }
    }